

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_reader_remaining(mpack_reader_t *reader,char **data)

{
  char *pcVar1;
  
  if (reader->error != mpack_ok) {
    return 0;
  }
  pcVar1 = reader->data;
  if (data != (char **)0x0) {
    *data = pcVar1;
  }
  return (long)reader->end - (long)pcVar1;
}

Assistant:

size_t mpack_reader_remaining(mpack_reader_t* reader, const char** data) {
    if (mpack_reader_error(reader) != mpack_ok)
        return 0;

    #if MPACK_READ_TRACKING
    if (mpack_reader_flag_if_error(reader, mpack_track_check_empty(&reader->track)) != mpack_ok)
        return 0;
    #endif

    if (data)
        *data = reader->data;
    return (size_t)(reader->end - reader->data);
}